

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O2

void __thiscall Pl_Flate::finish(Pl_Flate *this)

{
  void *pvVar1;
  int error_code;
  runtime_error *this_00;
  Members *this_01;
  uchar buf [1];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  this_01 = (this->m)._M_t.
            super___uniq_ptr_impl<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>._M_t.
            super__Tuple_impl<0UL,_Pl_Flate::Members_*,_std::default_delete<Pl_Flate::Members>_>.
            super__Head_base<0UL,_Pl_Flate::Members_*,_false>._M_head_impl;
  if (this_01->written <= (anonymous_namespace)::memory_limit_) {
    if (((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          )*(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&(this_01->zopfli_buf)._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
       (*(long *)&(this_01->outbuf).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> !=
        0)) {
      if (this_01->initialized == true) {
        pvVar1 = this_01->zdata;
        _buf = (element_type *)((ulong)_buf & 0xffffffffffffff00);
        handleData(this,buf,0,4);
        if (((this->m)._M_t.
             super___uniq_ptr_impl<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>._M_t.
             super__Tuple_impl<0UL,_Pl_Flate::Members_*,_std::default_delete<Pl_Flate::Members>_>.
             super__Head_base<0UL,_Pl_Flate::Members_*,_false>._M_head_impl)->action == a_deflate) {
          error_code = deflateEnd(pvVar1);
        }
        else {
          error_code = inflateEnd(pvVar1);
        }
        ((this->m)._M_t.
         super___uniq_ptr_impl<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>._M_t.
         super__Tuple_impl<0UL,_Pl_Flate::Members_*,_std::default_delete<Pl_Flate::Members>_>.
         super__Head_base<0UL,_Pl_Flate::Members_*,_false>._M_head_impl)->initialized = false;
        checkError(this,"End",error_code);
        this_01 = (this->m)._M_t.
                  super___uniq_ptr_impl<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_Pl_Flate::Members_*,_std::default_delete<Pl_Flate::Members>_>
                  .super__Head_base<0UL,_Pl_Flate::Members_*,_false>._M_head_impl;
      }
      _buf = (element_type *)0x0;
      a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)this_01,
                 (__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)buf);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
    }
    (*((this->super_Pipeline).next_)->_vptr_Pipeline[3])();
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"PL_Flate memory limit exceeded");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
Pl_Flate::finish()
{
    if (m->written > memory_limit_) {
        throw std::runtime_error("PL_Flate memory limit exceeded");
    }
    try {
        if (m->zopfli_buf) {
            finish_zopfli();
        } else if (m->outbuf.get()) {
            if (m->initialized) {
                z_stream& zstream = *(static_cast<z_stream*>(m->zdata));
                unsigned char buf[1];
                buf[0] = '\0';
                handleData(buf, 0, Z_FINISH);
                int err = Z_OK;
                if (m->action == a_deflate) {
                    err = deflateEnd(&zstream);
                } else {
                    err = inflateEnd(&zstream);
                }
                m->initialized = false;
                checkError("End", err);
            }

            m->outbuf = nullptr;
        }
    } catch (std::exception& e) {
        try {
            next()->finish();
        } catch (...) {
            // ignore secondary exception
        }
        throw std::runtime_error(e.what());
    }
    next()->finish();
}